

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

exr_result_t
exr_attr_string_set_with_length(exr_context_t ctxt,exr_attr_string_t *s,char *d,int32_t len)

{
  char *__dest;
  exr_result_t eVar1;
  ulong __n;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if (s == (exr_attr_string_t *)0x0) {
      eVar1 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid string argument to string set");
      return eVar1;
    }
    if (len < 0) {
      eVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Received request to assign a negative sized string (%d)",len,
                         *(code **)(ctxt + 0x48));
      return eVar1;
    }
    if (s->alloc_size <= len) {
      exr_attr_string_destroy(ctxt,s);
      eVar1 = exr_attr_string_create_with_length(ctxt,s,d,len);
      return eVar1;
    }
    s->length = len;
    __dest = s->str;
    eVar1 = 0;
    if (len == 0) {
      __n = 0;
    }
    else {
      __n = (ulong)(uint)len;
      if (d == (char *)0x0) {
        memset(__dest,0,__n);
      }
      else {
        strncpy(__dest,d,__n);
      }
    }
    __dest[__n] = '\0';
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_set_with_length (
    exr_context_t ctxt, exr_attr_string_t* s, const char* d, int32_t len)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!s)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid string argument to string set");

    if (len < 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to assign a negative sized string (%d)",
            len);

    if (s->alloc_size > len)
    {
        s->length = len;
        /* we own the memory */
        char* sstr = EXR_CONST_CAST (char*, s->str);
        if (len > 0)
        {
#ifdef _MSC_VER
#    pragma warning(push)
#    pragma warning(disable : 4996)
#endif
            if (d)
                strncpy (sstr, d, (size_t) len);
            else
                memset (sstr, 0, (size_t) len);
#ifdef _MSC_VER
#    pragma warning(pop)
#endif
        }
        sstr[len] = '\0';
        return EXR_ERR_SUCCESS;
    }
    exr_attr_string_destroy (ctxt, s);
    return exr_attr_string_create_with_length (ctxt, s, d, len);
}